

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprog.c
# Opt level: O0

void pulse_prog_formian_queen(CHAR_DATA *mob)

{
  bool bVar1;
  int iVar2;
  OBJ_DATA *obj;
  CHAR_DATA *ch;
  CHAR_DATA *in_RDI;
  OBJ_DATA *egg;
  OBJ_AFFECT_DATA oaf;
  AFFECT_DATA af;
  int incubation;
  int vnum;
  int rand;
  undefined4 in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  int in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff28;
  int vnum_00;
  int in_stack_ffffffffffffffcc;
  OBJ_INDEX_DATA *in_stack_ffffffffffffffd0;
  
  vnum_00 = (int)((ulong)in_stack_ffffffffffffff28 >> 0x20);
  if (((in_RDI->in_room != (ROOM_INDEX_DATA *)0x0) && (in_RDI->fighting == (CHAR_DATA *)0x0)) &&
     (bVar1 = is_affected(in_RDI,(int)gsn_timer), !bVar1)) {
    iVar2 = number_range(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
    ch = (CHAR_DATA *)(ulong)(iVar2 - 1);
    switch(ch) {
    case (CHAR_DATA *)0x0:
    case (CHAR_DATA *)0x1:
    case (CHAR_DATA *)0x2:
    case (CHAR_DATA *)0x3:
      break;
    case (CHAR_DATA *)0x4:
    case (CHAR_DATA *)0x5:
    case (CHAR_DATA *)0x6:
      break;
    case (CHAR_DATA *)0x7:
    case (CHAR_DATA *)0x8:
      break;
    case (CHAR_DATA *)0x9:
    }
    get_obj_index(vnum_00);
    obj = create_object(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
    obj_to_room(obj,in_RDI->in_room);
    init_affect((AFFECT_DATA *)0x685a0b);
    affect_to_char(ch,(AFFECT_DATA *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    init_affect_obj((OBJ_AFFECT_DATA *)0x685a58);
    affect_to_obj((OBJ_DATA *)ch,
                  (OBJ_AFFECT_DATA *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  }
  return;
}

Assistant:

void pulse_prog_formian_queen(CHAR_DATA *mob)
{
	int rand, vnum = 0, incubation = 0;
	AFFECT_DATA af;
	OBJ_AFFECT_DATA oaf;
	OBJ_DATA *egg;

	if (!mob->in_room)
		return;

	if (mob->fighting)
		return;

	if (is_affected(mob, gsn_timer))
		return;

	rand = number_range(1, 10);

	switch (rand)
	{
		case 1:
		case 2:
		case 3:
		case 4:
			vnum = 3212; // worker
			incubation = 35;
			break;
		case 5:
		case 6:
		case 7:
			vnum = 3213; // warrior
			incubation = 45;
			break;
		case 8:
		case 9:
			vnum = 3214; // taskmaster
			incubation = 55;
			break;
		case 10:
			vnum = 3215; // queen guard
			incubation = 65;
			break;
		default:
			vnum = 3212;
			break;
	}

	egg = create_object(get_obj_index(vnum), 0);
	obj_to_room(egg, mob->in_room);

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = AFT_TIMER;
	af.type = gsn_timer;
	af.duration = 20;
	affect_to_char(mob, &af);

	init_affect_obj(&oaf);
	oaf.where = TO_OBJ_AFFECTS;
	oaf.type = gsn_timer;
	oaf.aftype = AFT_TIMER;
	oaf.duration = incubation;
	oaf.end_fun = formian_egg_hatch;
	affect_to_obj(egg, &oaf);
}